

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# models.cpp
# Opt level: O1

void __thiscall Axes::Axes(Axes *this)

{
  this->a1 = 0.0;
  this->a2 = 0.0;
  this->a3 = 0.0;
  this->a4 = 0.0;
  this->a5 = 0.0;
  this->a6 = 0.0;
  return;
}

Assistant:

Axes::Axes()
{
    this->a1 = 0;
    this->a2 = 0;
    this->a3 = 0;
    this->a4 = 0;
    this->a5 = 0;
    this->a6 = 0;
}